

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tree.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  undefined1 local_208 [8];
  MatchTable table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [8];
  string number;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [8];
  string integer;
  allocator local_d1;
  string local_d0 [8];
  string digit;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  string id;
  allocator local_69;
  string local_68 [8];
  string stra;
  allocator local_31;
  string local_30 [8];
  string letter;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::operator+((char *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(_|");
  std::operator+(local_90,(char *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"(1|2|3|4|5|6|7|8|9|0)",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::operator+((char *)local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(+|-)?");
  std::operator+(local_f8,(char *)local_118);
  std::__cxx11::string::~string(local_118);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &table.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(char *)local_f8);
  std::operator+(local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &table.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::operator+(local_198,(char *)local_1b8);
  std::operator+(local_178,(char *)local_198);
  std::operator+(local_158,local_178);
  std::operator+(local_138,(char *)local_158);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string
            ((string *)
             &table.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  MatchTable::MatchTable((MatchTable *)local_208);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  MatchTable::add((MatchTable *)local_208,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  MatchTable::add((MatchTable *)local_208,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  MatchTable::add((MatchTable *)local_208,pcVar2);
  MatchTable::generate((MatchTable *)local_208);
  iVar1 = MatchTable::match((MatchTable *)local_208,"_func");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = MatchTable::match((MatchTable *)local_208,"234");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = MatchTable::match((MatchTable *)local_208,"23.23e12");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  MatchTable::~MatchTable((MatchTable *)local_208);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    string letter = "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z"
                    "|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)";
    string stra = "";
    string id = "(_|" + letter + ")+";
    string digit = "(1|2|3|4|5|6|7|8|9|0)";
    string integer = "(+|-)?" + digit + "+";
    string number = integer + "(\\." + digit + "+)?" + "((e|E)" + integer + "+)?";
    // (+|-)?(1|2|3|4|5|6|7|8|9|0)+(\.(1|2|3|4|5|6|7|8|9|0)+)?((e|E)(+|-)?(1|2|3|4|5|6|7|8|9|0)++)?
//    RegexTree tree1(number.c_str());
//
//    RegexTree::display_node(tree1.getRoot(), cout);
//
//    auto dt = generate_Dtran(tree1);
//
//    cout << endl;
//    for (int i = 0; i < dt.dtran.size(); i++) {
//        cout << i << ". ";
//        cout << "{";
//        for (int j = 0; j < 256; j++) {
//            if (dt.dtran[i][j] != 0) cout << (char)j << ": " << dt.dtran[i][j] << ", ";
//        }
//        cout << "}" << endl;
//    }
//    cout << "targets: ";
//    for (int k : dt.targets) cout << k << " ";
//
//    cout << "\nresult: " << boolalpha << dt.match("-1.234E20") << endl;
    MatchTable table;
    table.add(id.c_str());
    table.add(integer.c_str());
    table.add(number.c_str());
    table.generate();

    cout << table.match("_func") << endl;
    cout << table.match("234") << endl;
    cout << table.match("23.23e12") << endl;

    return 0;
}